

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O3

IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
* __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
          (IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
           *__return_storage_ptr__,
          LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,Literal *lit,
          bool complementary,bool retrieveSubstitutions,AbstractingUnifier *args,
          AbstractionOracle args_1,bool args_2)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  Get<0U,_Ts> *value;
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>
  *extraout_RDX;
  Get<1U,_Ts> *value_00;
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>
  *extraout_RDX_00;
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>
  *is;
  Option<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
  out;
  anon_class_48_6_5ce745bf iter;
  undefined1 local_131;
  long *local_130;
  Literal *local_128;
  anon_class_16_2_20c24dd8 local_120;
  OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
  local_110;
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>
  local_ec;
  IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>_>_>
  local_cc;
  AbstractingUnifier *local_b0;
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>
  local_a4;
  OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
  local_84;
  undefined1 local_60 [40];
  undefined1 *local_38;
  
  local_131 = args_2;
  local_128 = lit;
  local_b0 = args;
  local_60._0_8_ = getTree(this,lit,complementary);
  local_120.iter = (anon_class_48_6_5ce745bf *)local_60;
  local_60._32_8_ = &args_1;
  local_60._8_8_ = lit;
  local_60[0x10] = retrieveSubstitutions;
  local_60._24_8_ = &local_b0;
  local_38 = &local_131;
  if (((SubstitutionTree *)local_60._0_8_)->_root == (Node *)0x0) {
LAB_00344b2a:
    local_120.lit = &local_128;
    local_110._isSome = false;
    Lib::
    VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
    ::getEmpty();
    Lib::
    Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
    ::variant<0u>(&local_a4,
                  (Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
                   *)&local_130,value);
    Lib::
    OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
    ::OptionBase(&local_84,&local_a4);
    Lib::
    OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
    ::operator=(&local_110,&local_84);
    Lib::
    OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
    ::~OptionBase(&local_84);
    Lib::CoproductImpl::
    RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
                *)&local_a4,(anon_class_8_1_8991fb9c)&local_a4);
    if (local_130 != (long *)0x0) {
      plVar1 = local_130 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      if ((int)*plVar1 == 0) {
        (**(code **)(*local_130 + 8))();
      }
    }
    if ((local_110._isSome & 1U) != 0) {
      bVar2 = true;
      Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>_>_>
      ::DefaultImpl(&local_ec._inner,
                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>_>_>
                     *)&local_110._elem);
      is = extraout_RDX;
      goto LAB_00344bda;
    }
  }
  else {
    iVar3 = (*((SubstitutionTree *)local_60._0_8_)->_root->_vptr_Node[3])();
    local_120.lit = &local_128;
    local_110._isSome = false;
    if ((char)iVar3 != '\0') goto LAB_00344b2a;
  }
  getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Kernel::AbstractingUnifier_*,_Kernel::AbstractionOracle,_bool>
  ::anon_class_16_2_20c24dd8::operator()(&local_cc,&local_120);
  Lib::
  Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
  ::variant<1u>(&local_ec,
                (Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
                 *)&local_cc,value_00);
  bVar2 = false;
  is = extraout_RDX_00;
LAB_00344bda:
  Lib::
  coproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
            (__return_storage_ptr__,(Lib *)&local_ec,is);
  if (bVar2) {
    Lib::CoproductImpl::
    RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
                *)&local_ec,(anon_class_8_1_8991fb9c)&local_ec);
  }
  else {
    Lib::CoproductImpl::
    RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>>
                *)&local_ec,(anon_class_8_1_8991fb9c)&local_ec);
    Lib::CoproductImpl::
    RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Inferences::ALASCA::BinaryResolutionConf::Lhs>>>>>>
                *)&local_cc,(anon_class_8_1_8991fb9c)&local_cc);
  }
  Lib::
  OptionBase<Lib::Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
  ::~OptionBase(&local_110);
  return __return_storage_ptr__;
}

Assistant:

auto getResultIterator(Literal* lit, bool complementary, bool retrieveSubstitutions, Args... args)
  {
    auto tree = &getTree(lit, complementary);

    auto iter = [tree, lit, retrieveSubstitutions, &args...](bool reversed) 
      { return tree->template iterator<Iterator>(lit, retrieveSubstitutions, reversed, args...); };

    return ifElseIter(
        tree->isEmpty(), [&]() { return VirtualIterator<ELEMENT_TYPE(Iterator)>::getEmpty(); },
                         [&]() { return ifElseIter(!lit->isEquality(),
                                 [&]() { return iter(/* reverse */ false); },
                                 [&]() { return concatIters(iter(/* reverse */ false), iter(/* reverse */ true)); }); }
        );
  }